

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O1

QString * __thiscall
ImportBaseFuncWrapper::getName(QString *__return_storage_ptr__,ImportBaseFuncWrapper *this)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QString functionName;
  QString t;
  QString libName;
  QString local_a0;
  QArrayData *local_88;
  char16_t *local_80;
  qsizetype qStack_78;
  QArrayData *local_70;
  char16_t *local_68;
  qsizetype qStack_60;
  QArrayData *local_58;
  char16_t *local_50;
  long local_48;
  QString local_40;
  QArrayData *local_28 [3];
  
  getLibName(&local_40,this);
  getShortName(&local_a0,this);
  if (local_40.d.size == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = local_a0.d.d;
    local_a0.d.d = (Data *)0x0;
    pcVar1 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).ptr = local_a0.d.ptr;
    qVar2 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_a0.d.size;
    local_a0.d.ptr = pcVar1;
    local_a0.d.size = qVar2;
  }
  else {
    local_58 = &(local_40.d.d)->super_QArrayData;
    local_50 = local_40.d.ptr;
    local_48 = local_40.d.size;
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar3.m_data = (storage_type *)0x1;
    QVar3.m_size = (qsizetype)&local_70;
    QString::fromUtf8(QVar3);
    QString::append((QString *)&local_70);
    local_88 = local_70;
    local_80 = local_68;
    qStack_78 = qStack_60;
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_70->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar4.m_data = (storage_type *)0x2;
    QVar4.m_size = (qsizetype)local_28;
    QString::fromUtf8(QVar4);
    QString::append((QString *)&local_88);
    if (local_28[0] != (QArrayData *)0x0) {
      LOCK();
      (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_28[0],2,8);
      }
    }
    (__return_storage_ptr__->d).d = (Data *)local_88;
    (__return_storage_ptr__->d).ptr = local_80;
    (__return_storage_ptr__->d).size = qStack_78;
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_88->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_88->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::append((QString *)__return_storage_ptr__);
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,8);
      }
    }
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,8);
      }
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,8);
      }
    }
  }
  if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString ImportBaseFuncWrapper::getName()
{
    QString libName = getLibName();
    QString functionName = getShortName();

    if (!libName.length()) return functionName;

    return "[" + QString(libName) + "]." + functionName;
}